

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O1

void __thiscall
Inline::Optimize(Inline *this,Func *func,Instr **callerArgOuts,ArgSlot callerArgOutCount,
                uint recursiveInlineDepth)

{
  byte *pbVar1;
  int *piVar2;
  Type *ppSVar3;
  byte bVar4;
  short sVar5;
  ushort uVar6;
  InlineCacheIndex inlineCacheIndex;
  JITTimeWorkItem *this_00;
  long lVar7;
  Opnd *pOVar8;
  Func *pFVar9;
  code *pcVar10;
  uint uVar11;
  Type pJVar12;
  bool bVar13;
  OpndKind OVar14;
  bool bVar15;
  ProfileId PVar16;
  ProfileId PVar17;
  ValueType VVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  JITTimeFunctionBody *pJVar22;
  FunctionJITTimeInfo *pFVar23;
  undefined7 extraout_var;
  FunctionJITTimeInfo *this_01;
  SymOpnd *this_02;
  SymOpnd *this_03;
  char16_t *this_04;
  PropertySymOpnd *pPVar24;
  StackSym *pSVar25;
  ByteCodeUsesInstr *this_05;
  Instr *pIVar26;
  ProfiledInstr *pPVar27;
  char16 *pcVar28;
  char16 *pcVar29;
  intptr_t iVar30;
  intptr_t iVar31;
  undefined7 extraout_var_00;
  char *pcVar32;
  Func *pFVar33;
  undefined6 in_register_0000000a;
  char *topFunction;
  ulong uVar34;
  undefined1 isBuiltIn;
  undefined8 extraout_RDX;
  ulong uVar35;
  uint uVar36;
  Instr *pIVar37;
  undefined **this_06;
  Type in_register_00000084;
  undefined8 unaff_R12;
  TypePropertyGuardDictionary *this_07;
  char16_t *pcVar38;
  Func *this_08;
  char16_t *pcVar39;
  Func *this_09;
  char cVar40;
  undefined4 uVar41;
  undefined1 local_148 [8];
  uint16 constantArguments;
  PropertyGuardByPropertyIdMap *local_f0;
  CtorCachesByPropertyIdMap *local_e8;
  Instr *local_e0;
  Func *local_d8;
  Phases *local_d0;
  undefined4 local_c4;
  Func *local_c0;
  Type local_b8;
  Type local_ac;
  Func *local_a8;
  undefined8 local_a0;
  Func *local_98;
  Func *local_90;
  Func *local_88;
  Func *local_80;
  Instr *local_78;
  Func *local_70;
  Func *local_68;
  byte local_59;
  Func *local_58;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_4a;
  uint local_48;
  uint16 constantArguments_1;
  uint local_40;
  ValueType builtInReturnType;
  bool isInlined;
  BranchInstr *branch;
  Func *pFVar42;
  
  local_a0._4_4_ = in_register_00000084;
  local_a0._0_4_ = recursiveInlineDepth;
  local_c4 = (undefined4)CONCAT62(in_register_0000000a,callerArgOutCount);
  local_f0 = (PropertyGuardByPropertyIdMap *)callerArgOuts;
  local_88 = func;
  bVar13 = Func::DoGlobOpt(func);
  if (!bVar13) {
    return;
  }
  bVar13 = Func::DoGlobOpt(this->topFunc);
  pFVar33 = local_88;
  if (!bVar13) {
    return;
  }
  local_c0 = (Func *)this;
  pJVar22 = JITTimeWorkItem::GetJITFunctionBody(local_88->m_workItem);
  uVar19 = JITTimeFunctionBody::GetSourceContextId(pJVar22);
  pFVar23 = JITTimeWorkItem::GetJITTimeInfo(pFVar33->m_workItem);
  uVar20 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar23);
  local_59 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,FixedMethodsPhase,uVar19,uVar20);
  local_80 = (Func *)JITTimeWorkItem::GetJITTimeInfo(pFVar33->m_workItem);
  uVar19 = FunctionJITTimeInfo::GetInlineeCount((FunctionJITTimeInfo *)local_80);
  uVar34 = CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
  if (uVar19 == 0) {
    bVar13 = FunctionJITTimeInfo::IsLdFldInlineePresent((FunctionJITTimeInfo *)local_80);
    uVar34 = CONCAT71(extraout_var,bVar13) & 0xffffffff;
  }
  pFVar33 = local_c0;
  pJVar22 = JITTimeWorkItem::GetJITFunctionBody
                      ((JITTimeWorkItem *)
                       (local_c0->m_alloc->super_ArenaAllocator).
                       super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                       super_ArenaData.mallocBlocks);
  uVar19 = JITTimeFunctionBody::GetSourceContextId(pJVar22);
  pFVar23 = JITTimeWorkItem::GetJITTimeInfo
                      ((JITTimeWorkItem *)
                       (pFVar33->m_alloc->super_ArenaAllocator).
                       super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                       super_ArenaData.mallocBlocks);
  uVar20 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar23);
  bVar13 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,InlinePhase,uVar19,uVar20);
  pFVar33 = local_88;
  if (!bVar13) {
    pJVar22 = JITTimeWorkItem::GetJITFunctionBody(local_88->m_workItem);
    uVar19 = JITTimeFunctionBody::GetSourceContextId(pJVar22);
    pFVar23 = JITTimeWorkItem::GetJITTimeInfo(pFVar33->m_workItem);
    uVar20 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar23);
    bVar13 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,InlinePhase,uVar19,uVar20);
    if ((!bVar13) && (bVar13 = Func::IsJitInDebugMode(local_88), !bVar13)) goto LAB_00544ce5;
  }
  uVar34 = 0;
LAB_00544ce5:
  this_09 = local_c0;
  local_88->actualCount = (ArgSlot)local_c4;
  *(uint *)&local_c0->m_threadContextInfo = local_88->m_forInLoopBaseDepth;
  local_c0->m_polymorphicInlineCacheInfo = (JITTimePolymorphicInlineCacheInfo *)0x0;
  pFVar33 = (Func *)local_88->m_headInstr;
  this_06 = &PTR_0155fe48;
  topFunction = (char *)local_88;
  local_78 = (Instr *)__tls_get_addr();
  local_59 = local_59 ^ 1;
  local_d8 = (Func *)&DAT_015d3490;
  local_90 = (Func *)&DAT_015bbe90;
  local_d0 = (Phases *)&DAT_015b0240;
  local_e8 = (CtorCachesByPropertyIdMap *)&DAT_015cd718;
  local_ac = 0;
  local_a8 = (Func *)0x0;
  local_98 = (Func *)0x0;
  local_40 = (uint)uVar34;
  do {
    this_08 = pFVar33;
    pIVar26 = local_78;
    if (this_08 == (Func *)0x0) goto LAB_00546720;
    pFVar33 = (Func *)this_08->m_threadContextInfo;
    builtInReturnType.field_0.bits._1_1_ = 0;
    if ((char)uVar34 == '\0') goto LAB_00545a2c;
    uVar6 = (ushort)this_08->constructorCacheCount;
    pFVar42 = (Func *)0x0;
    uVar41 = 0;
    if (uVar6 < 199) {
      if (uVar6 < 0x68) {
        if (uVar6 < 0x59) {
          if (uVar6 == 0x1f) {
LAB_00545389:
            local_68 = (Func *)CONCAT44(local_68._4_4_,uVar41);
            pFVar42 = (Func *)GetMethodLdOpndForCallInstr((Inline *)this_06,(Instr *)this_08);
            uVar19 = *(uint *)&this_09->m_runtimeInfo;
            this_04 = (char16_t *)local_80;
            uVar20 = FunctionJITTimeInfo::GetInlineeCount((FunctionJITTimeInfo *)local_80);
            if (uVar19 == uVar20) {
              if (pFVar42 != (Func *)0x0) {
                this_04 = (char16_t *)pFVar42;
                bVar13 = IR::PropertySymOpnd::ShouldResetObjTypeSpecFldInfo
                                   ((PropertySymOpnd *)pFVar42);
                if (bVar13) {
                  pFVar42->constructorCaches = (JITTimeConstructorCache **)0x0;
                  pbVar1 = (byte *)((long)&pFVar42->ctorCachesByPropertyId + 1);
                  *pbVar1 = *pbVar1 & 0xfe;
                  *(undefined2 *)((long)&pFVar42->ctorCachesByPropertyId + 2) = 0;
                }
                if (pFVar42 != (Func *)0x0) {
                  lVar7 = *(long *)&pFVar42->constructorCacheCount;
                  uVar34 = (ulong)local_40;
                  uVar21 = (uint)local_68;
joined_r0x005458f7:
                  if ((lVar7 != 0) && (-1 < *(char *)&pFVar42->ctorCachesByPropertyId)) {
                    *(undefined8 *)&pFVar42->constructorCacheCount = 0;
                  }
                  goto LAB_00545909;
                }
              }
LAB_00545c87:
              isBuiltIn = 0;
              topFunction = (char *)0x0;
              cVar40 = '\x05';
              uVar34 = (ulong)local_40;
              uVar21 = (uint)local_68;
            }
            else {
              local_70 = pFVar42;
              if (*(char *)((long)&this_08->constructorCaches + 1) == '\x04') {
                uVar21 = *(uint *)&this_08->propertyGuardsByPropertyId;
                uVar36 = uVar21 & 0xffff;
                this_04 = (char16_t *)JITTimeWorkItem::GetJITFunctionBody(local_88->m_workItem);
                PVar17 = JITTimeFunctionBody::GetProfiledCallSiteCount
                                   ((JITTimeFunctionBody *)this_04);
                pFVar42 = local_70;
                uVar11 = local_40;
                if (uVar36 < PVar17) {
                  PVar17 = (ProfileId)uVar21;
                  pFVar42 = (Func *)FunctionJITTimeInfo::GetInlinee
                                              ((FunctionJITTimeInfo *)local_80,PVar17);
                  uVar11 = local_40;
                  if (pFVar42 == (Func *)0x0) {
                    bVar13 = Js::PhaseIsEnabled::InlineCallbacksPhase<Func*>(local_88);
                    if (bVar13) {
                      pIVar26 = TryGetCallbackDefInstrForCallInstr
                                          ((Inline *)this_09,(Instr *)this_08);
                    }
                    else {
                      pIVar26 = (Instr *)0x0;
                    }
                    if (pIVar26 == (Instr *)0x0) {
                      this_04 = (char16_t *)0x0;
                      pFVar42 = local_70;
                      goto joined_r0x005458c0;
                    }
                  }
                  else {
                    pIVar26 = (Instr *)0x0;
                  }
                  local_b8 = (Type)(ulong)uVar36;
                  if (pFVar42 == (Func *)0x0) {
                    uVar34 = 0;
                    pIVar37 = local_78;
                  }
                  else {
                    bVar13 = FunctionJITTimeInfo::IsPolymorphicCallSite
                                       ((FunctionJITTimeInfo *)local_80,PVar17);
                    pIVar37 = local_78;
                    if (bVar13) {
                      bVar13 = Js::PhaseIsEnabled::InlineCallbacksPhase<Func*>(local_88);
                      uVar34 = CONCAT71((int7)((ulong)topFunction >> 8),1);
                      if (bVar13) {
                        pIVar26 = TryGetCallbackDefInstrForCallInstr
                                            ((Inline *)this_09,(Instr *)this_08);
                        uVar34 = CONCAT71((int7)(uVar34 >> 8),pIVar26 == (Instr *)0x0);
                      }
                    }
                    else {
                      uVar34 = 0;
                    }
                  }
                  local_48 = (uint)uVar34;
                  local_e0 = pIVar26;
                  if (pIVar26 != (Instr *)0x0) {
                    local_58 = pFVar33;
                    pPVar27 = IR::Instr::AsProfiledInstr(pIVar26);
                    uVar6 = (pPVar27->u).field_3.fldInfoData.f1;
                    pFVar23 = JITTimeWorkItem::GetJITTimeInfo(pIVar26->m_func->m_workItem);
                    pFVar42 = (Func *)FunctionJITTimeInfo::GetCallbackInlinee(pFVar23,uVar6);
                    pJVar22 = JITTimeWorkItem::GetJITFunctionBody
                                        ((JITTimeWorkItem *)
                                         (this_09->m_alloc->super_ArenaAllocator).
                                         super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                         .super_ArenaData.mallocBlocks);
                    uVar19 = JITTimeFunctionBody::GetSourceContextId(pJVar22);
                    pFVar23 = JITTimeWorkItem::GetJITTimeInfo
                                        ((JITTimeWorkItem *)
                                         (this_09->m_alloc->super_ArenaAllocator).
                                         super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                         .super_ArenaData.mallocBlocks);
                    uVar20 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar23);
                    bVar13 = Js::Phases::IsEnabled
                                       ((Phases *)local_d8,InlineCallbacksPhase,uVar19,uVar20);
                    if (bVar13) {
LAB_00545e06:
                      pFVar33 = local_80;
                      pJVar22 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_80);
                      pcVar28 = JITTimeFunctionBody::GetDisplayName(pJVar22);
                      pcVar29 = FunctionJITTimeInfo::GetDebugNumberSet
                                          ((FunctionJITTimeInfo *)pFVar33,(wchar (*) [42])local_148)
                      ;
                      Output::Print(L"INLINING : Inlining callback at\tCallSite: %d\tCaller: %s (%s)\n"
                                    ,(ulong)uVar6,pcVar28,pcVar29);
                      Output::Flush();
                    }
                    else {
                      pJVar22 = JITTimeWorkItem::GetJITFunctionBody
                                          ((JITTimeWorkItem *)
                                           (this_09->m_alloc->super_ArenaAllocator).
                                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                           .super_ArenaData.mallocBlocks);
                      uVar19 = JITTimeFunctionBody::GetSourceContextId(pJVar22);
                      pFVar23 = JITTimeWorkItem::GetJITTimeInfo
                                          ((JITTimeWorkItem *)
                                           (this_09->m_alloc->super_ArenaAllocator).
                                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                           .super_ArenaData.mallocBlocks);
                      uVar20 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar23);
                      bVar13 = Js::Phases::IsEnabled
                                         ((Phases *)local_e8,InlineCallbacksPhase,uVar19,uVar20);
                      if (bVar13) goto LAB_00545e06;
                    }
                    uVar34 = (ulong)local_48;
                    pIVar37 = local_78;
                    pFVar33 = local_58;
                  }
                  pFVar9 = local_70;
                  if ((char)uVar34 == '\0') {
                    local_58 = pFVar42;
                    if (local_70 != (Func *)0x0) {
                      bVar13 = IR::PropertySymOpnd::ShouldResetObjTypeSpecFldInfo
                                         ((PropertySymOpnd *)local_70);
                      if (bVar13) {
                        pFVar9->constructorCaches = (JITTimeConstructorCache **)0x0;
                        pbVar1 = (byte *)((long)&pFVar9->ctorCachesByPropertyId + 1);
                        *pbVar1 = *pbVar1 & 0xfe;
                        *(undefined2 *)((long)&pFVar9->ctorCachesByPropertyId + 2) = 0;
                      }
                      if (((pFVar9 != (Func *)0x0) && (*(long *)&pFVar9->constructorCacheCount != 0)
                          ) && (-1 < *(char *)&pFVar9->ctorCachesByPropertyId)) {
                        *(undefined8 *)&pFVar9->constructorCacheCount = 0;
                      }
                    }
                    ValueType::ValueType((ValueType *)&constantArguments_1);
                    pFVar42 = local_58;
                    if ((char)local_68 == '\0') {
LAB_00546075:
                      bVar13 = InliningDecider::GetBuiltInInfo
                                         ((FunctionJITTimeInfo *)pFVar42,(OpCode *)local_148,
                                          (ValueType *)&constantArguments_1);
                      pFVar42 = local_58;
                      local_70 = (Func *)CONCAT44(local_70._4_4_,
                                                  (int)CONCAT71(extraout_var_00,bVar13));
                      bVar13 = ValueType::IsUninitialized((ValueType *)&constantArguments_1);
                      if ((!bVar13) && (this_08->pinnedTypeRefs != (TypeRefSet *)0x0)) {
                        bVar13 = FunctionJITTimeInfo::HasBody((FunctionJITTimeInfo *)pFVar42);
                        if (bVar13) {
                          AssertCount = AssertCount + 1;
                          Js::Throw::LogAssert();
                          *(undefined4 *)&pIVar37->_vptr_Instr = 1;
                          bVar13 = Js::Throw::ReportAssert
                                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                              ,0x12a,"(!inlineeData->HasBody())",
                                              "!inlineeData->HasBody()");
                          if (!bVar13) goto LAB_0054679e;
                          *(undefined4 *)&pIVar37->_vptr_Instr = 0;
                        }
                        if ((short)this_08->constructorCacheCount == 199) {
                          AssertCount = AssertCount + 1;
                          Js::Throw::LogAssert();
                          *(undefined4 *)&pIVar37->_vptr_Instr = 1;
                          bVar13 = Js::Throw::ReportAssert
                                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                              ,299,"(instr->m_opcode != Js::OpCode::NewScObjArray)",
                                              "We should have broken out of the switch statement earlier on this opcode."
                                             );
                          if (!bVar13) goto LAB_0054679e;
                          *(undefined4 *)&pIVar37->_vptr_Instr = 0;
                        }
                        if ((short)this_08->constructorCacheCount == 199) {
                          local_4a = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                                      &(this_08->pinnedTypeRefs->
                                       super_BaseDictionary<void_*,_void_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                                       ).entries;
                          bVar13 = ValueType::IsLikelyNativeArray((ValueType *)&local_4a.field_0);
                          if (bVar13) goto LAB_0054618b;
                        }
                        pOVar8 = (Opnd *)this_08->pinnedTypeRefs;
                        VVar18 = ValueType::ToLikely((ValueType *)&constantArguments_1);
                        IR::Opnd::SetValueType(pOVar8,VVar18);
                      }
LAB_0054618b:
                      bVar13 = FunctionJITTimeInfo::HasBody((FunctionJITTimeInfo *)pFVar42);
                      if (bVar13) {
                        uVar19 = FunctionJITTimeInfo::GetSourceContextId
                                           ((FunctionJITTimeInfo *)pFVar42);
                        uVar20 = FunctionJITTimeInfo::GetLocalFunctionId
                                           ((FunctionJITTimeInfo *)pFVar42);
                        pcVar32 = (char *)local_90;
                        bVar13 = Js::Phases::IsEnabled
                                           ((Phases *)local_90,InlineCandidatePhase,uVar19,uVar20);
                      }
                      else {
                        pcVar32 = (char *)local_90;
                        bVar13 = Js::Phases::IsEnabled((Phases *)local_90,InlineBuiltInPhase);
                      }
                      uVar34 = (ulong)local_40;
                      cVar40 = '\x05';
                      if ((bVar13 == false) &&
                         ((pcVar32 = (char *)local_58,
                          bVar13 = FunctionJITTimeInfo::HasBody((FunctionJITTimeInfo *)local_58),
                          pFVar42 = local_58, bVar13 || (local_148._0_2_ != L'\0')))) {
                        pcVar32 = (char *)local_58;
                        bVar13 = FunctionJITTimeInfo::HasBody((FunctionJITTimeInfo *)local_58);
                        if (bVar13) {
                          pcVar32 = (char *)FunctionJITTimeInfo::GetBody
                                                      ((FunctionJITTimeInfo *)pFVar42);
                          bVar13 = JITTimeFunctionBody::HasProfileInfo
                                             ((JITTimeFunctionBody *)pcVar32);
                          pFVar42 = local_88;
                          if (bVar13) {
                            local_4a.bits = 0;
                            pJVar22 = JITTimeWorkItem::GetJITFunctionBody(local_88->m_workItem);
                            uVar19 = JITTimeFunctionBody::GetSourceContextId(pJVar22);
                            pFVar23 = JITTimeWorkItem::GetJITTimeInfo(pFVar42->m_workItem);
                            uVar20 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar23);
                            bVar13 = Js::Phases::IsEnabled
                                               ((Phases *)local_90,InlineRecursivePhase,uVar19,
                                                uVar20);
                            if (!bVar13) {
                              IR::Instr::
                              IterateArgInstrs<Inline::Optimize(Func*,IR::Instr**,unsigned_short,unsigned_int)::__0>
                                        ((Instr *)this_08,(anon_class_8_1_406103b2)&local_4a);
                            }
                            pFVar9 = (Func *)this_09->m_alloc;
                            pcVar32 = (char *)this_09->m_workItem;
                            bVar13 = IsInliningOutSideLoops((Inline *)this_09);
                            pFVar42 = local_58;
                            bVar15 = InliningHeuristics::BackendInlineIntoInliner
                                               ((InliningHeuristics *)pcVar32,
                                                (FunctionJITTimeInfo *)local_58,local_88,pFVar9,
                                                (ProfileId)local_b8,(bool)(char)local_68,true,bVar13
                                                ,*(int *)((long)&this_09->m_threadContextInfo + 4)
                                                 != 0,(uint)local_a0,local_4a.bits);
                            bVar13 = true;
                            uVar34 = (ulong)local_40;
                            if (bVar15) goto LAB_0054666c;
                            cVar40 = !bVar15 * '\x05';
                          }
                        }
                        else {
                          if (local_148._0_2_ == L'\0') {
                            AssertCount = AssertCount + 1;
                            Js::Throw::LogAssert();
                            pIVar26 = local_78;
                            *(undefined4 *)&local_78->_vptr_Instr = 1;
                            pcVar32 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                            ;
                            bVar13 = Js::Throw::ReportAssert
                                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                                ,0x146,"(builtInInlineCandidateOpCode != 0)",
                                                "builtInInlineCandidateOpCode != 0");
                            if (!bVar13) goto LAB_0054679e;
                            *(undefined4 *)&pIVar26->_vptr_Instr = 0;
                          }
                          if ((char)local_68 == '\0') {
                            bVar15 = ValueType::IsUninitialized((ValueType *)&constantArguments_1);
                            pFVar42 = local_58;
                            bVar13 = true;
                            if ((!bVar15) && ((Opnd *)this_08->pinnedTypeRefs != (Opnd *)0x0)) {
                              IR::Opnd::SetValueType
                                        ((Opnd *)this_08->pinnedTypeRefs,
                                         (ValueType)constantArguments_1);
                              bVar13 = ValueType::IsDefinite((ValueType *)&constantArguments_1);
                              if (bVar13) {
                                pbVar1 = (byte *)((long)&(this_08->pinnedTypeRefs->
                                                                                                                  
                                                  super_BaseDictionary<void_*,_void_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                                                  ).entries + 3);
                                *pbVar1 = *pbVar1 | 1;
                                bVar13 = false;
                              }
                              else {
                                bVar13 = false;
                              }
                            }
LAB_0054666c:
                            pcVar32 = (char *)this_09;
                            if (local_148._0_2_ == L'\0') {
                              pFVar33 = (Func *)InlineScriptFunction
                                                          ((Inline *)this_09,(Instr *)this_08,
                                                           (FunctionJITTimeInfo *)pFVar42,
                                                           (StackSym *)local_98,(ProfileId)local_b8,
                                                           (bool *)((long)&builtInReturnType.field_0
                                                                           .bits + 1),local_e0,
                                                           (uint)local_a0);
                            }
                            else {
                              pFVar33 = (Func *)InlineBuiltInFunction
                                                          ((Inline *)this_09,(Instr *)this_08,
                                                           (FunctionJITTimeInfo *)pFVar42,
                                                           local_148._0_2_,
                                                           (FunctionJITTimeInfo *)local_80,
                                                           (StackSym *)local_98,
                                                           (bool *)((long)&builtInReturnType.field_0
                                                                           .bits + 1),(uint)local_b8
                                                           ,(uint)local_a0,(Instr *)this_08);
                            }
                            cVar40 = '\0';
                            if (!bVar13 && builtInReturnType.field_0.bits._1_1_ == '\0') {
                              pbVar1 = (byte *)((long)&(this_08->pinnedTypeRefs->
                                                                                                              
                                                  super_BaseDictionary<void_*,_void_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                                                  ).entries + 3);
                              *pbVar1 = *pbVar1 & 0xfe;
                              pcVar32 = (char *)this_08->pinnedTypeRefs;
                              local_4a = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                                          &((Func *)pcVar32)->m_runtimeInfo;
                              VVar18 = ValueType::ToLikely((ValueType *)&local_4a.field_0);
                              uVar34 = (ulong)local_40;
                              IR::Opnd::SetValueType((Opnd *)pcVar32,VVar18);
                              cVar40 = '\0';
                            }
                          }
                        }
                      }
                      uVar35 = (ulong)local_70 & 0xffffffff;
                    }
                    else {
                      iVar30 = FunctionJITTimeInfo::GetFunctionInfoAddr
                                         ((FunctionJITTimeInfo *)local_58);
                      iVar31 = ThreadContextInfo::GetJavascriptArrayNewInstanceAddr
                                         ((ThreadContextInfo *)
                                          (this_09->m_alloc->super_ArenaAllocator).
                                          super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                          .super_ArenaData.bigBlocks);
                      pIVar37 = local_78;
                      if (iVar30 != iVar31) goto LAB_00546075;
                      *(undefined2 *)&this_08->constructorCacheCount = 199;
                      pcVar32 = (char *)this_08;
                      pPVar27 = IR::Instr::AsProfiledInstr((Instr *)this_08);
                      (pPVar27->u).profileId = 0xffff;
                      cVar40 = '\x05';
                      uVar35 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
                      uVar34 = (ulong)local_40;
                    }
                    topFunction = (char *)(ulong)local_48;
                    uVar41 = (undefined4)uVar35;
                    this_04 = (char16_t *)pcVar32;
                    if (cVar40 == '\0') {
LAB_0054620b:
                      local_70 = (Func *)CONCAT44(local_70._4_4_,uVar41);
                      uVar20 = *(int *)&this_09->m_runtimeInfo + 1;
                      *(uint *)&this_09->m_runtimeInfo = uVar20;
                      this_04 = (char16_t *)local_80;
                      uVar19 = FunctionJITTimeInfo::GetInlineeCount((FunctionJITTimeInfo *)local_80)
                      ;
                      if (uVar20 == uVar19) {
                        this_04 = (char16_t *)local_80;
                        bVar13 = FunctionJITTimeInfo::IsLdFldInlineePresent
                                           ((FunctionJITTimeInfo *)local_80);
                        cVar40 = '\x01';
                        if ((bVar13 | local_59) == 1) goto LAB_0054623b;
                      }
                      else {
LAB_0054623b:
                        cVar40 = '\x05';
                      }
                      topFunction = (char *)(ulong)local_48;
                      isBuiltIn = SUB81(local_70,0);
                      uVar21 = (uint)local_68;
                      goto LAB_0054626e;
                    }
                  }
                  else {
                    if ((char)local_68 == '\0') {
                      pJVar22 = JITTimeWorkItem::GetJITFunctionBody
                                          ((JITTimeWorkItem *)
                                           (this_09->m_alloc->super_ArenaAllocator).
                                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                           .super_ArenaData.mallocBlocks);
                      uVar19 = JITTimeFunctionBody::GetSourceContextId(pJVar22);
                      pFVar23 = JITTimeWorkItem::GetJITTimeInfo
                                          ((JITTimeWorkItem *)
                                           (this_09->m_alloc->super_ArenaAllocator).
                                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                           .super_ArenaData.mallocBlocks);
                      uVar20 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar23);
                      bVar13 = Js::Phases::IsEnabled
                                         ((Phases *)local_90,PolymorphicInlinePhase,uVar19,uVar20);
                      pFVar42 = local_88;
                      if (!bVar13) {
                        pJVar22 = JITTimeWorkItem::GetJITFunctionBody(local_88->m_workItem);
                        uVar19 = JITTimeFunctionBody::GetSourceContextId(pJVar22);
                        pFVar23 = JITTimeWorkItem::GetJITTimeInfo(pFVar42->m_workItem);
                        uVar20 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar23);
                        bVar13 = Js::Phases::IsEnabled
                                           ((Phases *)local_90,PolymorphicInlinePhase,uVar19,uVar20)
                        ;
                        if (bVar13) goto LAB_00545ef2;
                        bVar13 = IsInliningOutSideLoops((Inline *)this_09);
                        if (bVar13) {
                          pJVar22 = JITTimeWorkItem::GetJITFunctionBody
                                              ((JITTimeWorkItem *)
                                               (this_09->m_alloc->super_ArenaAllocator).
                                               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                               .super_ArenaData.mallocBlocks);
                          uVar19 = JITTimeFunctionBody::GetSourceContextId(pJVar22);
                          pFVar23 = JITTimeWorkItem::GetJITTimeInfo
                                              ((JITTimeWorkItem *)
                                               (this_09->m_alloc->super_ArenaAllocator).
                                               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                               .super_ArenaData.mallocBlocks);
                          uVar20 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar23);
                          bVar13 = Js::Phases::IsEnabled(local_d0,InlinePhase,uVar19,uVar20);
                          pFVar42 = local_88;
                          if (!bVar13) {
                            pJVar22 = JITTimeWorkItem::GetJITFunctionBody(local_88->m_workItem);
                            uVar19 = JITTimeFunctionBody::GetSourceContextId(pJVar22);
                            pFVar23 = JITTimeWorkItem::GetJITTimeInfo(pFVar42->m_workItem);
                            uVar20 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar23);
                            bVar13 = Js::Phases::IsEnabled(local_d0,InlinePhase,uVar19,uVar20);
                            if (!bVar13) goto LAB_00545ef2;
                          }
                        }
                        pJVar22 = JITTimeWorkItem::GetJITFunctionBody
                                            ((JITTimeWorkItem *)
                                             (this_09->m_alloc->super_ArenaAllocator).
                                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                             .super_ArenaData.mallocBlocks);
                        uVar19 = JITTimeFunctionBody::GetSourceContextId(pJVar22);
                        pFVar23 = JITTimeWorkItem::GetJITTimeInfo
                                            ((JITTimeWorkItem *)
                                             (this_09->m_alloc->super_ArenaAllocator).
                                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                             .super_ArenaData.mallocBlocks);
                        uVar20 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar23);
                        pFVar33 = local_90;
                        bVar13 = Js::Phases::IsEnabled
                                           ((Phases *)local_90,FixedMethodsPhase,uVar19,uVar20);
                        if (bVar13) {
LAB_005464aa:
                          pFVar33 = local_70;
                          pJVar12 = local_b8;
                          uVar34 = (ulong)local_40;
                          if (local_70 != (Func *)0x0) {
                            bVar13 = IR::PropertySymOpnd::ShouldResetObjTypeSpecFldInfo
                                               ((PropertySymOpnd *)local_70);
                            if (bVar13) {
                              pFVar33->constructorCaches = (JITTimeConstructorCache **)0x0;
                              pbVar1 = (byte *)((long)&pFVar33->ctorCachesByPropertyId + 1);
                              *pbVar1 = *pbVar1 & 0xfe;
                              *(undefined2 *)((long)&pFVar33->ctorCachesByPropertyId + 2) = 0;
                            }
                            if (((pFVar33 != (Func *)0x0) &&
                                (*(long *)&pFVar33->constructorCacheCount != 0)) &&
                               (-1 < *(char *)&pFVar33->ctorCachesByPropertyId)) {
                              *(undefined8 *)&pFVar33->constructorCacheCount = 0;
                            }
                          }
                          pFVar33 = (Func *)InlinePolymorphicFunction
                                                      ((Inline *)this_09,(Instr *)this_08,
                                                       (FunctionJITTimeInfo *)local_80,
                                                       (StackSym *)local_98,(ProfileId)pJVar12,
                                                       (bool *)((long)&builtInReturnType.field_0.
                                                                       bits + 1),(uint)local_a0,
                                                       false);
                          uVar41 = 0;
                        }
                        else {
                          pJVar22 = JITTimeWorkItem::GetJITFunctionBody
                                              ((JITTimeWorkItem *)
                                               (this_09->m_alloc->super_ArenaAllocator).
                                               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                               .super_ArenaData.mallocBlocks);
                          uVar19 = JITTimeFunctionBody::GetSourceContextId(pJVar22);
                          pFVar23 = JITTimeWorkItem::GetJITTimeInfo
                                              ((JITTimeWorkItem *)
                                               (this_09->m_alloc->super_ArenaAllocator).
                                               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                               .super_ArenaData.mallocBlocks);
                          uVar20 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar23);
                          bVar13 = Js::Phases::IsEnabled
                                             ((Phases *)pFVar33,PolymorphicInlineFixedMethodsPhase,
                                              uVar19,uVar20);
                          if (bVar13) goto LAB_005464aa;
                          pFVar33 = (Func *)InlinePolymorphicFunctionUsingFixedMethods
                                                      ((Inline *)this_09,(Instr *)this_08,
                                                       (FunctionJITTimeInfo *)local_80,
                                                       (StackSym *)local_98,(ProfileId)local_b8,
                                                       (PropertySymOpnd *)local_70,
                                                       (bool *)((long)&builtInReturnType.field_0.
                                                                       bits + 1),(uint)local_a0);
                          uVar41 = 0;
                          uVar34 = (ulong)local_40;
                        }
                        goto LAB_0054620b;
                      }
                    }
LAB_00545ef2:
                    this_04 = (char16_t *)local_d8;
                    bVar13 = Js::Phases::IsEnabled((Phases *)local_d8,PolymorphicInlinePhase);
                    pFVar42 = local_80;
                    if (bVar13) {
                      pcVar39 = L"false";
                      pcVar38 = L"false";
                      if ((char)local_68 != '\0') {
                        pcVar38 = L"true";
                      }
                      if ((Func *)this_09->m_alloc != local_88) {
                        pcVar39 = L"true";
                      }
                      pJVar22 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_80);
                      local_58 = (Func *)JITTimeFunctionBody::GetDisplayName(pJVar22);
                      pcVar28 = FunctionJITTimeInfo::GetDebugNumberSet
                                          ((FunctionJITTimeInfo *)pFVar42,(wchar (*) [42])local_148)
                      ;
                      this_04 = 
                      L"INLINING (Polymorphic): Skip Inline: Inlining polymorphic call site outside loop\tIsConstructorCall: %s \tisTopFunc: %s\tCaller: %s (%s)\n"
                      ;
                      Output::Print(L"INLINING (Polymorphic): Skip Inline: Inlining polymorphic call site outside loop\tIsConstructorCall: %s \tisTopFunc: %s\tCaller: %s (%s)\n"
                                    ,pcVar38,pcVar39,local_58,pcVar28);
                      Output::Flush();
                    }
                    pFVar42 = local_70;
                    uVar34 = (ulong)local_40;
                    topFunction = (char *)(ulong)local_48;
                    if (local_70 != (Func *)0x0) {
                      this_04 = (char16_t *)local_70;
                      bVar13 = IR::PropertySymOpnd::ShouldResetObjTypeSpecFldInfo
                                         ((PropertySymOpnd *)local_70);
                      if (bVar13) {
                        pFVar42->constructorCaches = (JITTimeConstructorCache **)0x0;
                        pbVar1 = (byte *)((long)&pFVar42->ctorCachesByPropertyId + 1);
                        *pbVar1 = *pbVar1 & 0xfe;
                        *(undefined2 *)((long)&pFVar42->ctorCachesByPropertyId + 2) = 0;
                      }
                      topFunction = (char *)(ulong)local_48;
                      if (((pFVar42 != (Func *)0x0) &&
                          (*(long *)&pFVar42->constructorCacheCount != 0)) &&
                         (-1 < *(char *)&pFVar42->ctorCachesByPropertyId)) {
                        *(undefined8 *)&pFVar42->constructorCacheCount = 0;
                      }
                    }
                    cVar40 = '\x05';
                    uVar35 = 0;
                  }
                }
                else {
joined_r0x005458c0:
                  uVar34 = (ulong)uVar11;
                  local_70 = pFVar42;
                  if (pFVar42 != (Func *)0x0) {
                    this_04 = (char16_t *)pFVar42;
                    bVar13 = IR::PropertySymOpnd::ShouldResetObjTypeSpecFldInfo
                                       ((PropertySymOpnd *)pFVar42);
                    if (bVar13) {
                      pFVar42->constructorCaches = (JITTimeConstructorCache **)0x0;
                      pbVar1 = (byte *)((long)&pFVar42->ctorCachesByPropertyId + 1);
                      *pbVar1 = *pbVar1 & 0xfe;
                      *(undefined2 *)((long)&pFVar42->ctorCachesByPropertyId + 2) = 0;
                    }
                    uVar21 = (uint)local_68;
                    goto joined_r0x0054587e;
                  }
                  cVar40 = '\x05';
                  uVar35 = 0;
                  topFunction = (char *)0x0;
                }
                isBuiltIn = (undefined1)uVar35;
                uVar21 = (uint)local_68;
              }
              else {
                if (pFVar42 == (Func *)0x0) goto LAB_00545c87;
                this_04 = (char16_t *)pFVar42;
                bVar13 = IR::PropertySymOpnd::ShouldResetObjTypeSpecFldInfo
                                   ((PropertySymOpnd *)pFVar42);
                if (bVar13) {
                  pFVar42->constructorCaches = (JITTimeConstructorCache **)0x0;
                  pbVar1 = (byte *)((long)&pFVar42->ctorCachesByPropertyId + 1);
                  *pbVar1 = *pbVar1 & 0xfe;
                  *(undefined2 *)((long)&pFVar42->ctorCachesByPropertyId + 2) = 0;
                }
                uVar34 = (ulong)local_40;
                uVar21 = (uint)local_68;
joined_r0x0054587e:
                if (pFVar42 != (Func *)0x0) {
                  lVar7 = *(long *)&pFVar42->constructorCacheCount;
                  goto joined_r0x005458f7;
                }
LAB_00545909:
                isBuiltIn = 0;
                cVar40 = '\x05';
                topFunction = (char *)0x0;
              }
            }
LAB_0054626e:
            if (cVar40 != '\x05') {
              bVar15 = false;
              goto LAB_00545c5d;
            }
            this_06 = (undefined **)(ulong)uVar21;
            pFVar42 = (Func *)topFunction;
            goto LAB_00545a33;
          }
          if (uVar6 != 0x21) goto LAB_005456e0;
          uVar19 = *(uint *)&this_09->m_runtimeInfo;
          uVar20 = FunctionJITTimeInfo::GetInlineeCount((FunctionJITTimeInfo *)local_80);
          if (uVar19 == uVar20) goto LAB_005454fa;
          if (*(char *)((long)&this_08->constructorCaches + 1) == '\x04') {
            PVar17 = *(ProfileId *)&this_08->propertyGuardsByPropertyId;
            pJVar22 = JITTimeWorkItem::GetJITFunctionBody(local_88->m_workItem);
            PVar16 = JITTimeFunctionBody::GetProfiledCallSiteCount(pJVar22);
            if ((PVar17 < PVar16) &&
               (pFVar23 = FunctionJITTimeInfo::GetInlinee((FunctionJITTimeInfo *)local_80,PVar17),
               pFVar23 != (FunctionJITTimeInfo *)0x0)) {
              bVar13 = Lowerer::IsSpreadCall((Instr *)this_08);
              uVar34 = (ulong)local_40;
              if (bVar13) {
                InlineSpread((Inline *)this_09,(Instr *)this_08);
              }
              this_06 = (undefined **)0x0;
              isBuiltIn = false;
              pFVar42 = (Func *)0x0;
              goto LAB_00545a33;
            }
            goto LAB_005456cc;
          }
        }
        else {
          if (uVar6 != 0x59) {
            if (uVar6 == 0x5e) goto LAB_005450db;
            goto LAB_005456e0;
          }
          topFunction = (char *)(ulong)(ushort)local_c4;
          InlConstFoldArg((Inline *)this_09,(Instr *)this_08,(Instr **)local_f0,(ushort)local_c4);
        }
LAB_00545a2c:
        this_06 = (undefined **)0x0;
        isBuiltIn = false;
        pFVar42 = (Func *)0x0;
      }
      else if (uVar6 < 0xb4) {
        if ((uVar6 != 0x68) && (uVar6 != 0x70)) goto LAB_005456e0;
LAB_005450db:
        bVar13 = FunctionJITTimeInfo::IsLdFldInlineePresent((FunctionJITTimeInfo *)local_80);
        if (!bVar13) goto LAB_005454fa;
        if ((*(char *)((long)&this_08->constructorCaches + 1) != '\x04') ||
           (((ulong)this_08->propertyGuardsByPropertyId & 0x80000) == 0)) goto LAB_00545a2c;
        sVar5 = (short)this_08->constructorCacheCount;
        pOVar8 = (Opnd *)(&this_08->pinnedTypeRefs)[sVar5 != 0x70];
        if (pOVar8 == (Opnd *)0x0) {
          this_06 = (undefined **)0x0;
          isBuiltIn = false;
          pFVar42 = (Func *)0x0;
          uVar34 = (ulong)local_40;
        }
        else {
          OVar14 = IR::Opnd::GetKind(pOVar8);
          if ((OVar14 != OpndKindSym) ||
             (this_02 = IR::Opnd::AsSymOpnd(pOVar8), this_02->m_sym->m_kind != SymKindProperty))
          goto LAB_005456cc;
          local_58 = pFVar33;
          this_03 = IR::Opnd::AsSymOpnd(&this_02->super_Opnd);
          bVar13 = IR::SymOpnd::IsPropertySymOpnd(this_03);
          if (!bVar13) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            pIVar26 = local_78;
            *(undefined4 *)&local_78->_vptr_Instr = 1;
            topFunction = "symOpnd->AsSymOpnd()->IsPropertySymOpnd()";
            bVar13 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                ,0x83,"(symOpnd->AsSymOpnd()->IsPropertySymOpnd())",
                                "symOpnd->AsSymOpnd()->IsPropertySymOpnd()");
            if (!bVar13) goto LAB_0054679e;
            *(undefined4 *)&pIVar26->_vptr_Instr = 0;
          }
          pPVar24 = IR::Opnd::AsPropertySymOpnd(&this_02->super_Opnd);
          inlineCacheIndex = pPVar24->m_inlineCacheIndex;
          pFVar23 = FunctionJITTimeInfo::GetLdFldInlinee
                              ((FunctionJITTimeInfo *)local_80,inlineCacheIndex);
          if ((pFVar23 != (FunctionJITTimeInfo *)0x0) &&
             (pJVar22 = FunctionJITTimeInfo::GetBody(pFVar23), pJVar22 != (JITTimeFunctionBody *)0x0
             )) {
            local_68 = (Func *)CONCAT44(local_68._4_4_,inlineCacheIndex);
            uVar19 = FunctionJITTimeInfo::GetSourceContextId(pFVar23);
            uVar20 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar23);
            pFVar33 = local_90;
            topFunction = (char *)(ulong)uVar20;
            bVar13 = Js::Phases::IsEnabled((Phases *)local_90,InlineCandidatePhase,uVar19,uVar20);
            if (!bVar13) {
              uVar19 = FunctionJITTimeInfo::GetSourceContextId(pFVar23);
              uVar20 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar23);
              topFunction = (char *)(ulong)uVar20;
              bVar13 = Js::Phases::IsEnabled((Phases *)pFVar33,InlineAccessorsPhase,uVar19,uVar20);
              if (!bVar13) {
                uVar19 = FunctionJITTimeInfo::GetSourceContextId(pFVar23);
                local_70 = (Func *)CONCAT44(local_70._4_4_,uVar19);
                uVar19 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar23);
                topFunction = (char *)(ulong)uVar19;
                bVar13 = Js::Phases::IsEnabled
                                   ((Phases *)pFVar33,sVar5 != 0x70 ^ InlineSettersPhase,
                                    (uint)local_70,uVar19);
                if (!bVar13) {
                  topFunction = (char *)local_98;
                  InlineGetterSetterFunction
                            ((Inline *)this_09,(Instr *)this_08,pFVar23,(StackSym *)local_98,
                             (uint)local_68,sVar5 != 0x70,
                             (bool *)((long)&builtInReturnType.field_0.bits + 1),(uint)local_a0);
                }
              }
            }
          }
          pFVar42 = (Func *)0x0;
          this_06 = (undefined **)0x0;
          isBuiltIn = false;
          uVar34 = (ulong)local_40;
          pFVar33 = local_58;
        }
      }
      else {
        if (uVar6 == 0xb4) {
          if (((Opnd *)this_08->pinnedTypeRefs == (Opnd *)0x0) ||
             (OVar14 = IR::Opnd::GetKind((Opnd *)this_08->pinnedTypeRefs), OVar14 != OpndKindReg)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)&pIVar26->_vptr_Instr = 1;
            bVar13 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                ,0x210,"(instr->GetDst() && instr->GetDst()->IsRegOpnd())",
                                "instr->GetDst() && instr->GetDst()->IsRegOpnd()");
            if (!bVar13) goto LAB_0054679e;
            *(undefined4 *)&pIVar26->_vptr_Instr = 0;
          }
          if (local_98 != (Func *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)&pIVar26->_vptr_Instr = 1;
            bVar13 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                ,0x211,"(symThis == nullptr)","symThis == nullptr");
            if (!bVar13) goto LAB_0054679e;
            *(undefined4 *)&pIVar26->_vptr_Instr = 0;
          }
          this_07 = (TypePropertyGuardDictionary *)this_08->pinnedTypeRefs;
LAB_0054566f:
          topFunction = (char *)this_08;
          OVar14 = IR::Opnd::GetKind((Opnd *)this_07);
          if (OVar14 != OpndKindReg) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            pIVar26 = local_78;
            *(undefined4 *)&local_78->_vptr_Instr = 1;
            topFunction = "Bad call to AsRegOpnd()";
            bVar13 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
            if (!bVar13) goto LAB_0054679e;
            *(undefined4 *)&pIVar26->_vptr_Instr = 0;
          }
          local_98 = (Func *)this_07->alloc;
LAB_005456cc:
          this_06 = (undefined **)0x0;
        }
        else {
          if (uVar6 != 0xc4) goto LAB_005456e0;
          pJVar22 = JITTimeWorkItem::GetJITFunctionBody
                              ((JITTimeWorkItem *)
                               (this_09->m_alloc->super_ArenaAllocator).
                               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                               .super_ArenaData.mallocBlocks);
          uVar19 = JITTimeFunctionBody::GetSourceContextId(pJVar22);
          pFVar23 = JITTimeWorkItem::GetJITTimeInfo
                              ((JITTimeWorkItem *)
                               (this_09->m_alloc->super_ArenaAllocator).
                               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                               .super_ArenaData.mallocBlocks);
          uVar20 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar23);
          topFunction = (char *)(ulong)uVar20;
          pFVar42 = local_90;
          bVar13 = Js::Phases::IsEnabled((Phases *)local_90,InlineConstructorsPhase,uVar19,uVar20);
          this_06 = (undefined **)CONCAT71((int7)((ulong)pFVar42 >> 8),1);
          if (!bVar13) {
            uVar41 = 1;
            goto LAB_00545389;
          }
        }
        uVar34 = (ulong)local_40;
LAB_005456d7:
        isBuiltIn = false;
        pFVar42 = (Func *)0x0;
      }
LAB_00545a33:
      bVar15 = true;
      this_04 = (char16_t *)this_06;
      if (builtInReturnType.field_0.bits._1_1_ == '\0') {
        sVar5 = (short)this_08->constructorCacheCount;
        if (sVar5 != 0x1f) {
          if ((sVar5 != 199) && (sVar5 != 0xc4)) goto LAB_00545c5d;
          this_06 = (undefined **)CONCAT71((int7)((ulong)this_06 >> 8),1);
        }
        local_68 = (Func *)this_06;
        pPVar24 = GetMethodLdOpndForCallInstr((Inline *)this_06,(Instr *)this_08);
        if (pPVar24 != (PropertySymOpnd *)0x0) {
          bVar13 = IR::PropertySymOpnd::ShouldResetObjTypeSpecFldInfo(pPVar24);
          if (bVar13) {
            pPVar24->objTypeSpecFldInfo = (ObjTypeSpecFldInfo *)0x0;
            pPVar24->field_0x61 = pPVar24->field_0x61 & 0xfe;
            pPVar24->slotIndex = 0;
          }
          if (((pPVar24 != (PropertySymOpnd *)0x0) &&
              (pPVar24->m_runtimePolymorphicInlineCache != (JITTimePolymorphicInlineCache *)0x0)) &&
             (-1 < (char)pPVar24->m_polyCacheUtil)) {
            pPVar24->m_runtimePolymorphicInlineCache = (JITTimePolymorphicInlineCache *)0x0;
          }
        }
        local_58 = pFVar33;
        pSVar25 = IR::Opnd::GetStackSym((Opnd *)this_08->singleTypeGuards);
        bVar4 = *(byte *)((long)&this_08->singleTypeGuards->entries + 3);
        constantArguments_1 = constantArguments_1 & 0xff00;
        topFunction = (char *)0x0;
        this_04 = (char16_t *)local_c0;
        bVar13 = TryOptimizeCallInstrWithFixedMethod
                           ((Inline *)local_c0,(Instr *)this_08,(FunctionJITTimeInfo *)0x0,
                            SUB81(pFVar42,0),(bool)isBuiltIn,(bool)(char)local_68,false,
                            (bool *)&constantArguments_1,false,0);
        pFVar33 = local_58;
        this_09 = local_c0;
        if (bVar13) {
          if (pSVar25 == (StackSym *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            pIVar26 = local_78;
            *(undefined4 *)&local_78->_vptr_Instr = 1;
            topFunction = "originalCallTargetStackSym != nullptr";
            bVar13 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                ,0x249,"(originalCallTargetStackSym != nullptr)",
                                "originalCallTargetStackSym != nullptr");
            if (!bVar13) {
LAB_0054679e:
              pcVar10 = (code *)invalidInstructionException();
              (*pcVar10)();
            }
            *(undefined4 *)&pIVar26->_vptr_Instr = 0;
          }
          this_05 = IR::ByteCodeUsesInstr::New((Instr *)this_08);
          IR::ByteCodeUsesInstr::SetRemovedOpndSymbol
                    (this_05,(bool)((bVar4 & 8) >> 3),(pSVar25->super_Sym).m_id);
          this_04 = (char16_t *)this_08;
          IR::Instr::InsertBefore((Instr *)this_08,&this_05->super_Instr);
          pFVar33 = local_58;
          this_09 = local_c0;
          if ((short)this_08->constructorCacheCount == 0xc4) {
            pJVar22 = JITTimeWorkItem::GetJITFunctionBody
                                ((JITTimeWorkItem *)
                                 (local_c0->m_alloc->super_ArenaAllocator).
                                 super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                 .super_ArenaData.mallocBlocks);
            uVar19 = JITTimeFunctionBody::GetSourceContextId(pJVar22);
            pFVar23 = JITTimeWorkItem::GetJITTimeInfo
                                ((JITTimeWorkItem *)
                                 (this_09->m_alloc->super_ArenaAllocator).
                                 super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                 .super_ArenaData.mallocBlocks);
            uVar20 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar23);
            topFunction = (char *)(ulong)uVar20;
            this_04 = (char16_t *)local_90;
            bVar13 = Js::Phases::IsEnabled((Phases *)local_90,SplitNewScObjectPhase,uVar19,uVar20);
            if (!bVar13) {
              topFunction = (char *)0x0;
              this_04 = (char16_t *)this_09;
              SplitConstructorCall
                        ((Inline *)this_09,(Instr *)this_08,false,true,(Instr **)0x0,(Instr **)0x0);
            }
          }
        }
        else if (((short)this_08->constructorCacheCount == 199) &&
                (this_08->pinnedTypeRefs != (TypeRefSet *)0x0)) {
          local_148._0_2_ =
               *(undefined2 *)
                &(this_08->pinnedTypeRefs->
                 super_BaseDictionary<void_*,_void_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                 ).entries;
          this_04 = (char16_t *)local_148;
          bVar13 = ValueType::IsLikelyNativeArray((ValueType *)this_04);
          if (bVar13) {
            topFunction = (char *)0xffffffff;
            this_04 = (char16_t *)this_08;
            IR::Instr::ConvertToBailOutInstr
                      ((Instr *)this_08,(Instr *)this_08,BailOutOnNotNativeArray,0xffffffff);
          }
        }
        bVar15 = true;
        uVar34 = (ulong)local_40;
      }
    }
    else {
      if (uVar6 < 0x179) {
        if (uVar6 < 0xe6) {
          this_06 = (undefined **)CONCAT71((int7)((ulong)this_06 >> 8),1);
          if (uVar6 == 199) {
            isBuiltIn = true;
            goto LAB_00545a33;
          }
          if (uVar6 != 0xe4) goto LAB_005456e0;
          bVar13 = JITTimeWorkItem::IsLoopBody(local_88->m_workItem);
          if (!bVar13) {
            *(int *)&this_09->m_threadContextInfo = *(int *)&this_09->m_threadContextInfo + 1;
          }
LAB_005454fa:
          this_06 = (undefined **)0x0;
          goto LAB_005456d7;
        }
        if (uVar6 == 0xe6) {
          bVar13 = JITTimeWorkItem::IsLoopBody(local_88->m_workItem);
          if (bVar13) goto LAB_005454fa;
          if (*(char *)((long)&this_08->constructorCaches + 1) != '\x02') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            pIVar26 = local_78;
            *(undefined4 *)&local_78->_vptr_Instr = 1;
            topFunction = "Bad call to AsBranchInstr()";
            bVar13 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
            if (!bVar13) goto LAB_0054679e;
            *(undefined4 *)&pIVar26->_vptr_Instr = 0;
          }
          ppSVar3 = &this_08->callSiteToArgumentsOffsetFixupMap[2].entries;
          *(byte *)ppSVar3 = *(byte *)ppSVar3 | 0x10;
        }
        else {
          if (uVar6 != 0x176) goto LAB_005456e0;
          if (local_a8 == (Func *)0x0) {
            cVar40 = *(char *)((long)&this_08->constructorCaches + 1);
            if ((cVar40 != '\x03') && (cVar40 != '\x05')) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              pIVar26 = local_78;
              *(undefined4 *)&local_78->_vptr_Instr = 1;
              topFunction = "Bad call to AsLabelInstr()";
              bVar13 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                  ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
              if (!bVar13) goto LAB_0054679e;
              *(undefined4 *)&pIVar26->_vptr_Instr = 0;
            }
            if (((ulong)this_08->propertiesWrittenTo & 1) == 0) {
              local_a8 = (Func *)0x0;
            }
            else {
              cVar40 = *(char *)((long)&this_08->constructorCaches + 1);
              if ((cVar40 != '\x03') && (cVar40 != '\x05')) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                pIVar26 = local_78;
                *(undefined4 *)&local_78->_vptr_Instr = 1;
                topFunction = "Bad call to AsLabelInstr()";
                bVar13 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                    ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
                if (!bVar13) goto LAB_0054679e;
                *(undefined4 *)&pIVar26->_vptr_Instr = 0;
              }
              piVar2 = (int *)((long)&this_09->m_threadContextInfo + 4);
              *piVar2 = *piVar2 + 1;
              local_ac = *(Type *)&this_08->ctorCachesByPropertyId;
              local_a8 = this_08;
            }
          }
          cVar40 = *(char *)((long)&this_08->constructorCaches + 1);
          if ((cVar40 != '\x03') && (cVar40 != '\x05')) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            pIVar26 = local_78;
            *(undefined4 *)&local_78->_vptr_Instr = 1;
            topFunction = "Bad call to AsLabelInstr()";
            bVar13 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
            if (!bVar13) goto LAB_0054679e;
            *(undefined4 *)&pIVar26->_vptr_Instr = 0;
          }
          if (((ulong)this_08->propertiesWrittenTo & 0x10) != 0) {
            if (*(int *)&this_09->m_threadContextInfo == 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              pIVar26 = local_78;
              *(undefined4 *)&local_78->_vptr_Instr = 1;
              topFunction = "this->currentForInDepth != 0";
              bVar13 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                  ,0x49,"(this->currentForInDepth != 0)",
                                  "this->currentForInDepth != 0");
              if (!bVar13) goto LAB_0054679e;
              *(undefined4 *)&pIVar26->_vptr_Instr = 0;
            }
            *(int *)&this_09->m_threadContextInfo = *(int *)&this_09->m_threadContextInfo + -1;
          }
        }
        goto LAB_00545a2c;
      }
      if (0x20d < uVar6) {
        if (uVar6 == 0x20e) {
          if ((this_08->singleTypeGuards == (TypePropertyGuardDictionary *)0x0) ||
             (OVar14 = IR::Opnd::GetKind((Opnd *)this_08->singleTypeGuards), OVar14 != OpndKindReg))
          {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)&pIVar26->_vptr_Instr = 1;
            bVar13 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                ,0x218,"(instr->GetSrc1() && instr->GetSrc1()->IsRegOpnd())",
                                "instr->GetSrc1() && instr->GetSrc1()->IsRegOpnd()");
            if (!bVar13) goto LAB_0054679e;
            *(undefined4 *)&pIVar26->_vptr_Instr = 0;
          }
          if (local_98 != (Func *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)&pIVar26->_vptr_Instr = 1;
            bVar13 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                ,0x219,"(symThis == nullptr)","symThis == nullptr");
            if (!bVar13) goto LAB_0054679e;
            *(undefined4 *)&pIVar26->_vptr_Instr = 0;
          }
          this_07 = this_08->singleTypeGuards;
          goto LAB_0054566f;
        }
        if (uVar6 == 0x220) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          pIVar26 = local_78;
          *(undefined4 *)&local_78->_vptr_Instr = 1;
          topFunction = "false";
          bVar13 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                              ,0x58,"(false)","false");
          if (!bVar13) goto LAB_0054679e;
          *(undefined4 *)&pIVar26->_vptr_Instr = 0;
          goto LAB_005454fa;
        }
LAB_005456e0:
        if (local_a8 != (Func *)0x0) {
          if (((*(char *)((long)&this_08->constructorCaches + 1) != '\x02') ||
              ((Func *)this_08->callSiteToArgumentsOffsetFixupMap != local_a8)) ||
             (local_ac = local_ac - 1, local_ac != 0)) goto LAB_00545a2c;
          if (*(int *)((long)&this_09->m_threadContextInfo + 4) == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            pIVar26 = local_78;
            *(undefined4 *)&local_78->_vptr_Instr = 1;
            topFunction = "this->isInLoop > 0";
            bVar13 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                ,0x22a,"(this->isInLoop > 0)","this->isInLoop > 0");
            if (!bVar13) goto LAB_0054679e;
            *(undefined4 *)&pIVar26->_vptr_Instr = 0;
          }
          piVar2 = (int *)((long)&this_09->m_threadContextInfo + 4);
          *piVar2 = *piVar2 + -1;
          local_ac = 0;
        }
        this_06 = (undefined **)0x0;
        isBuiltIn = false;
        local_a8 = (Func *)0x0;
        pFVar42 = (Func *)0x0;
        goto LAB_00545a33;
      }
      if (uVar6 == 0x179) {
        if (*(char *)((long)&this_08->constructorCaches + 1) != '\b') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          pIVar26 = local_78;
          *(undefined4 *)&local_78->_vptr_Instr = 1;
          topFunction = "Bad call to AsPragmaInstr()";
          bVar13 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                              ,0xb9,"(this->IsPragmaInstr())","Bad call to AsPragmaInstr()");
          if (!bVar13) goto LAB_0054679e;
          *(undefined4 *)&pIVar26->_vptr_Instr = 0;
        }
        this_09->m_polymorphicInlineCacheInfo = (JITTimePolymorphicInlineCacheInfo *)this_08;
        goto LAB_00545a2c;
      }
      if (uVar6 != 0x1b2) goto LAB_005456e0;
      uVar19 = *(uint *)&this_09->m_runtimeInfo;
      uVar20 = FunctionJITTimeInfo::GetInlineeCount((FunctionJITTimeInfo *)local_80);
      if (uVar19 == uVar20) goto LAB_005454fa;
      if (*(char *)((long)&this_08->constructorCaches + 1) != '\x04') goto LAB_00545a2c;
      uVar21 = *(uint *)&this_08->propertyGuardsByPropertyId;
      local_58 = pFVar33;
      pJVar22 = JITTimeWorkItem::GetJITFunctionBody(local_88->m_workItem);
      PVar17 = JITTimeFunctionBody::GetProfiledCallSiteCount(pJVar22);
      bVar13 = true;
      if ((uVar21 & 0xffff) < (uint)PVar17) {
        PVar17 = (ProfileId)uVar21;
        pFVar23 = FunctionJITTimeInfo::GetInlinee((FunctionJITTimeInfo *)local_80,PVar17);
        if (pFVar23 != (FunctionJITTimeInfo *)0x0) {
          uVar19 = FunctionJITTimeInfo::GetSourceContextId(pFVar23);
          uVar20 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar23);
          topFunction = (char *)(ulong)uVar20;
          bVar13 = Js::Phases::IsEnabled((Phases *)local_90,InlineCandidatePhase,uVar19,uVar20);
          if (!bVar13) {
            pJVar22 = FunctionJITTimeInfo::GetBody(pFVar23);
            bVar13 = JITTimeFunctionBody::HasProfileInfo(pJVar22);
            pFVar33 = local_88;
            if (bVar13) {
              local_148._0_2_ = L'\0';
              pJVar22 = JITTimeWorkItem::GetJITFunctionBody(local_88->m_workItem);
              uVar19 = JITTimeFunctionBody::GetSourceContextId(pJVar22);
              this_01 = JITTimeWorkItem::GetJITTimeInfo(pFVar33->m_workItem);
              uVar20 = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
              bVar13 = Js::Phases::IsEnabled((Phases *)local_90,InlineRecursivePhase,uVar19,uVar20);
              if (!bVar13) {
                IR::Instr::
                IterateArgInstrs<Inline::Optimize(Func*,IR::Instr**,unsigned_short,unsigned_int)::__1>
                          ((Instr *)this_08,(anon_class_8_1_406103b2)local_148);
              }
              topFunction = (char *)this_09->m_alloc;
              this_00 = this_09->m_workItem;
              bVar13 = IsInliningOutSideLoops((Inline *)this_09);
              bVar15 = InliningHeuristics::BackendInlineIntoInliner
                                 ((InliningHeuristics *)this_00,pFVar23,local_88,(Func *)topFunction
                                  ,PVar17,false,true,bVar13,
                                  *(int *)((long)&this_09->m_threadContextInfo + 4) != 0,
                                  (uint)local_a0,local_148._0_2_);
              bVar13 = true;
              if (bVar15) {
                topFunction = (char *)local_98;
                local_58 = (Func *)InlineScriptFunction
                                             ((Inline *)this_09,(Instr *)this_08,pFVar23,
                                              (StackSym *)local_98,PVar17,
                                              (bool *)((long)&builtInReturnType.field_0.bits + 1),
                                              (Instr *)0x0,(uint)local_a0);
                uVar20 = *(int *)&this_09->m_runtimeInfo + 1;
                *(uint *)&this_09->m_runtimeInfo = uVar20;
                uVar19 = FunctionJITTimeInfo::GetInlineeCount((FunctionJITTimeInfo *)local_80);
                bVar13 = uVar20 != uVar19;
              }
              uVar34 = (ulong)local_40;
              goto LAB_00545cb9;
            }
          }
          uVar34 = (ulong)local_40;
        }
        bVar13 = true;
      }
LAB_00545cb9:
      this_04 = (char16_t *)0x0;
      this_06 = (undefined **)0x0;
      isBuiltIn = false;
      pFVar42 = (Func *)0x0;
      bVar15 = false;
      pFVar33 = local_58;
      if (bVar13) goto LAB_00545a33;
    }
LAB_00545c5d:
    this_06 = (undefined **)this_04;
  } while (bVar15);
  if (this_08 == (Func *)0x0) {
LAB_00546720:
    pJVar22 = JITTimeWorkItem::GetJITFunctionBody
                        ((JITTimeWorkItem *)
                         (this_09->m_alloc->super_ArenaAllocator).
                         super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                         super_ArenaData.mallocBlocks);
    uVar19 = JITTimeFunctionBody::GetSourceContextId(pJVar22);
    pFVar23 = JITTimeWorkItem::GetJITTimeInfo
                        ((JITTimeWorkItem *)
                         (this_09->m_alloc->super_ArenaAllocator).
                         super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                         super_ArenaData.mallocBlocks);
    uVar20 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar23);
    bVar13 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,InlinePhase,uVar19,uVar20);
    if ((bVar13) || (bVar13 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,InlinePhase), bVar13)) {
      Output::Flush();
    }
  }
  return;
}

Assistant:

void
Inline::Optimize(Func *func, __in_ecount_opt(callerArgOutCount) IR::Instr *callerArgOuts[], Js::ArgSlot callerArgOutCount, uint recursiveInlineDepth)
{
    if (!func->DoInline() || !topFunc->DoInline())
    {
        return;
    }

    bool doFixedMethods = !PHASE_OFF(Js::FixedMethodsPhase, func);
    const FunctionJITTimeInfo * inlinerData = func->GetWorkItem()->GetJITTimeInfo();

    bool doInline = (inlinerData->GetInlineeCount() > 0 || inlinerData->IsLdFldInlineePresent());
    if (PHASE_OFF(Js::InlinePhase, this->topFunc) ||
        PHASE_OFF(Js::InlinePhase, func) ||
        func->IsJitInDebugMode())
    {
        doInline = false;
    }

    func->actualCount = callerArgOutCount;

    // Current for..in depth starts with the inlinee's base depth
    this->currentForInDepth = func->m_forInLoopBaseDepth;

    // Keep the caller's "this" symbol (if any).
    StackSym *symThis = nullptr;
    lastStatementBoundary = nullptr;
    IR::LabelInstr* loopTop = nullptr;
    int32 backEdgeCount = 0;

    // Profile data already filter call site outside of loops if the function has loops, so we don't need to detect that here.
    FOREACH_INSTR_EDITING(instr, instrNext, func->m_headInstr)
    {
        bool isInlined = false;
        bool isPolymorphic = false;
        bool isBuiltIn = false;
        bool isCtor = false;
        if (doInline)
        {
            switch (instr->m_opcode)
            {
            case Js::OpCode::StatementBoundary:
                lastStatementBoundary = instr->AsPragmaInstr();
                break;

            case Js::OpCode::Label:
                {
                    if (!loopTop && instr->AsLabelInstr()->m_isLoopTop)
                    {
                        // We only need to know if we are inside loop or not, it doesn't matter how many nested levels we are in.
                        // This is the cheap way of doing so.
                        loopTop = instr->AsLabelInstr();
                        AnalysisAssert(loopTop);
                        this->isInLoop++;
                        backEdgeCount = loopTop->labelRefs.Count();
                    }

                    if (instr->AsLabelInstr()->m_isForInExit)
                    {
                        AssertOrFailFast(this->currentForInDepth != 0);
                        this->currentForInDepth--;
                    }
                }
                break;
            case Js::OpCode::InitForInEnumerator:
                // Loop body uses the for in enumerator in the interpreter frame.
                // No need to keep track of its depth
                if (!func->IsLoopBody())
                {
                    this->currentForInDepth++;
                }
                break;
            case Js::OpCode::BrOnNotEmpty:
                // Byte code doesn't emit BrOnNotEmpty, and we have done any transformation yet.
                Assert(false);
                break;
            case Js::OpCode::BrOnEmpty:
                // Loop body uses the for in enumerator in the interpreter frame.
                // No need to keep track of its depth
                if (!func->IsLoopBody())
                {
                    instr->AsBranchInstr()->GetTarget()->m_isForInExit = true;
                }
                break;
            case Js::OpCode::StFld:
            case Js::OpCode::LdFld:
            case Js::OpCode::LdFldForCallApplyTarget:
                {
                    // Try inlining of getter setter
                    if (!inlinerData->IsLdFldInlineePresent())
                    {
                        break;
                    }

                    if (!instr->IsProfiledInstr())
                    {
                        break;
                    }

                    if (!(instr->AsProfiledInstr()->u.FldInfo().flags & Js::FldInfoFlags::FldInfo_FromAccessor))
                    {
                        break;
                    }

                    bool getter = instr->m_opcode != Js::OpCode::StFld;

                    IR::Opnd *opnd = getter ? instr->GetSrc1() : instr->GetDst();
                    if (!(opnd && opnd->IsSymOpnd()))
                    {
                        break;
                    }

                    IR::SymOpnd* symOpnd = opnd->AsSymOpnd();
                    if (!symOpnd->m_sym->IsPropertySym())
                    {
                        break;
                    }
                    Assert(symOpnd->AsSymOpnd()->IsPropertySymOpnd());

                    const auto inlineCacheIndex = symOpnd->AsPropertySymOpnd()->m_inlineCacheIndex;
                    const FunctionJITTimeInfo * inlineeData = inlinerData->GetLdFldInlinee(inlineCacheIndex);
                    if (!inlineeData)
                    {
                        break;
                    }

                    JITTimeFunctionBody * body = inlineeData->GetBody();
                    if (!body)
                    {
                        break;
                    }

                    bool isInlinePhaseOff = PHASE_OFF(Js::InlineCandidatePhase, inlineeData) ||
                                            PHASE_OFF(Js::InlineAccessorsPhase, inlineeData) ||
                                            (getter && PHASE_OFF(Js::InlineGettersPhase, inlineeData)) ||
                                            (!getter && PHASE_OFF(Js::InlineSettersPhase, inlineeData));

                    if (isInlinePhaseOff)
                    {
                        break;
                    }

                    this->InlineGetterSetterFunction(instr, inlineeData, symThis, inlineCacheIndex, getter /*isGetter*/, &isInlined, recursiveInlineDepth);

                    break;
                }

            case Js::OpCode::NewScObjArray:
                // We know we're not going to inline these. Just break out and try to do a fixed function check.
                isCtor = true;
                isBuiltIn = true;
                break;

            case Js::OpCode::NewScObject:
                isCtor = true;
                if (PHASE_OFF(Js::InlineConstructorsPhase, this->topFunc))
                {
                    break;
                }
                // fall-through

            case Js::OpCode::CallI:
                {

                    IR::PropertySymOpnd* methodValueOpnd = GetMethodLdOpndForCallInstr(instr);

                    if (this->inlineesProcessed == inlinerData->GetInlineeCount())
                    {
                        TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
                        TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
                        break;
                    }

                    if(!instr->IsProfiledInstr())
                    {
                        TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
                        TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
                        break;
                    }

                    const auto profileId = static_cast<Js::ProfileId>(instr->AsProfiledInstr()->u.profileId);
                    if(profileId >= func->GetJITFunctionBody()->GetProfiledCallSiteCount())
                    {
                        TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
                        TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
                        break;
                    }

                    const FunctionJITTimeInfo * inlineeData = inlinerData->GetInlinee(profileId);
                    IR::Instr * callbackDefInstr = nullptr;
                    if (inlineeData == nullptr)
                    {
                        if (PHASE_ENABLED(InlineCallbacksPhase, func))
                        {
                            callbackDefInstr = TryGetCallbackDefInstrForCallInstr(instr);
                        }

                        if (callbackDefInstr == nullptr)
                        {
                            TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
                            TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
                            break;
                        }
                    }

                    if (inlineeData != nullptr && inlinerData->IsPolymorphicCallSite(profileId))
                    {
                        if (PHASE_ENABLED(InlineCallbacksPhase, func))
                        {
                            callbackDefInstr = TryGetCallbackDefInstrForCallInstr(instr);
                            if (callbackDefInstr == nullptr)
                            {
                                isPolymorphic = true;
                            }
                        }
                        else
                        {
                            isPolymorphic = true;
                        }
                    }

                    if (callbackDefInstr != nullptr)
                    {
                        Js::ProfileId callSiteId = static_cast<Js::ProfileId>(callbackDefInstr->AsProfiledInstr()->u.profileId);
                        inlineeData = callbackDefInstr->m_func->GetWorkItem()->GetJITTimeInfo()->GetCallbackInlinee(callSiteId);

#if ENABLE_DEBUG_CONFIG_OPTIONS
                        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                        INLINE_CALLBACKS_TRACE(_u("INLINING : Inlining callback at\tCallSite: %d\tCaller: %s (%s)\n"),
                            callSiteId, inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
#endif
                    }

                    if (isPolymorphic)
                    {
                        if (isCtor ||
                            (PHASE_OFF(Js::PolymorphicInlinePhase, this->topFunc) || PHASE_OFF(Js::PolymorphicInlinePhase, func)) ||
                            (this->IsInliningOutSideLoops() && !PHASE_FORCE(Js::InlinePhase, this->topFunc) && !PHASE_FORCE(Js::InlinePhase, func)))
                        {
#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
                            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
                            POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic): Skip Inline: Inlining polymorphic call site outside loop\tIsConstructorCall: %s \tisTopFunc: %s\tCaller: %s (%s)\n"),
                                     (isCtor? _u("true"): _u("false")), (this->topFunc != func? _u("true"):_u("false")),
                                     inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));

                            // TODO: Constructor polymorphic inlining

                            TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
                            TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
                            break;
                        }
                        if (!PHASE_OFF(Js::FixedMethodsPhase, this->topFunc) && !PHASE_OFF(Js::PolymorphicInlineFixedMethodsPhase, this->topFunc))
                        {
                            instrNext = InlinePolymorphicFunctionUsingFixedMethods(instr, inlinerData, symThis, profileId, methodValueOpnd, &isInlined, recursiveInlineDepth);
                        }
                        else
                        {
                            TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
                            TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
                            instrNext = InlinePolymorphicFunction(instr, inlinerData, symThis, profileId, &isInlined, recursiveInlineDepth);
                        }
                    }
                    else
                    {
                        TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
                        TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
                        Js::OpCode builtInInlineCandidateOpCode;
                        ValueType builtInReturnType;

                        // If the inlinee info is the array constructor, just change the opcode to NewScObjArray
                        // so that we will inline the array allocation in lower
                        if (isCtor && inlineeData->GetFunctionInfoAddr() == this->topFunc->GetThreadContextInfo()->GetJavascriptArrayNewInstanceAddr())
                        {
                            isBuiltIn = true;
                            instr->m_opcode = Js::OpCode::NewScObjArray;
                            instr->AsProfiledInstr()->u.profileId = Js::Constants::NoProfileId;
                            break;
                        }

                        isBuiltIn = InliningDecider::GetBuiltInInfo(inlineeData, &builtInInlineCandidateOpCode, &builtInReturnType);

                        if(!builtInReturnType.IsUninitialized() && instr->GetDst())
                        {
                            Assert(!inlineeData->HasBody());
                            AssertMsg(instr->m_opcode != Js::OpCode::NewScObjArray, "We should have broken out of the switch statement earlier on this opcode.");
                            // Value types for the array built-in calls are pulled from the profile; don't change them here.
                            if ((instr->m_opcode != Js::OpCode::NewScObjArray) ||
                                !instr->GetDst()->GetValueType().IsLikelyNativeArray())
                            {
                                // Assume that this built-in function is not going to be inlined, so the return type cannot be definite
                                instr->GetDst()->SetValueType(builtInReturnType.ToLikely());
                            }
                        }

                        bool isInlinePhaseOff = inlineeData->HasBody() ?
                            PHASE_OFF(Js::InlineCandidatePhase, inlineeData) :
                            PHASE_OFF1(Js::InlineBuiltInPhase);
                        if (isInlinePhaseOff)
                        {
                            break;
                        }

                        if(!inlineeData->HasBody() && builtInInlineCandidateOpCode == 0)
                        {
                            // This built-in function is not going to be inlined
                            break;
                        }

                        bool hasDstUsedBuiltInReturnType = false;
                        if(!inlineeData->HasBody())
                        {
                            Assert(builtInInlineCandidateOpCode != 0);
                            if(isCtor)
                            {
                                // Inlining a built-in function called as a constructor is currently not supported. Although InliningDecider
                                // already checks for this, profile data matching with a function does not take into account the difference
                                // between a constructor call and a regular function call, so need to check it again.
                                break;
                            }

                            // This built-in function should be inlined, so reset the destination's value type
                            if(!builtInReturnType.IsUninitialized())
                            {
                                if(instr->GetDst())
                                {
                                    hasDstUsedBuiltInReturnType = true;
                                    instr->GetDst()->SetValueType(builtInReturnType);
                                    if(builtInReturnType.IsDefinite())
                                    {
                                        instr->GetDst()->SetValueTypeFixed();
                                    }
                                }
                            }
                        }
                        else
                        {

                            if (!inlineeData->GetBody()->HasProfileInfo())        // Don't try to inline a function if it doesn't have profile data
                            {
                                break;
                            }

                            uint16 constantArguments = 0;
                            if (!PHASE_OFF(Js::InlineRecursivePhase, func))
                            {
                                instr->IterateArgInstrs([&](IR::Instr* argInstr) {
                                    IR::Opnd *src1 = argInstr->GetSrc1();
                                    if (!src1->IsRegOpnd())
                                    {
                                        return false;
                                    }
                                    StackSym *sym = src1->AsRegOpnd()->m_sym;
                                    if (sym->IsIntConst())
                                    {
                                        if (argInstr->GetSrc2() && argInstr->GetSrc2()->IsSymOpnd())
                                        {
                                            StackSym *dstSym = argInstr->GetDst()->AsSymOpnd()->m_sym->AsStackSym();
                                            Assert(dstSym->IsSingleDef());
                                            Assert(dstSym->IsArgSlotSym());
                                            Js::ArgSlot argCount = dstSym->GetArgSlotNum() - 1;

                                            if (argCount == Js::Constants::MaximumArgumentCountForConstantArgumentInlining)
                                            {
                                                return true;
                                            }
                                            constantArguments |= (1 << argCount);
                                        }
                                    }
                                    return false;
                                });
                            }

                            if (!inliningHeuristics.BackendInlineIntoInliner(inlineeData,
                                func, this->topFunc, profileId, isCtor, true /*isFixedMethodCall*/,
                                this->IsInliningOutSideLoops(), this->isInLoop != 0, recursiveInlineDepth, constantArguments))
                            {
                                break;
                            }

                        }


                        instrNext = builtInInlineCandidateOpCode != 0 ?
                            this->InlineBuiltInFunction(instr, inlineeData, builtInInlineCandidateOpCode, inlinerData, symThis, &isInlined, profileId, recursiveInlineDepth, instr) :
                            this->InlineScriptFunction(instr, inlineeData, symThis, profileId, &isInlined, callbackDefInstr, recursiveInlineDepth);
                        if (!isInlined && hasDstUsedBuiltInReturnType)
                        {
                            // We haven't actually inlined the builtin, we need to revert the value type to likely
                            instr->GetDst()->UnsetValueTypeFixed();
                            instr->GetDst()->SetValueType(instr->GetDst()->GetValueType().ToLikely());
                        }
                    }
                    if(++this->inlineesProcessed == inlinerData->GetInlineeCount())
                    {
                        // getterSetter inline caches are shared and we have no way of knowing how many more are present
                        if (!inlinerData->IsLdFldInlineePresent() && !doFixedMethods)
                        {
                            return ;
                        }
                    }
                    break;
                }
            case Js::OpCode::AsmJsCallI:
            {
                if (this->inlineesProcessed == inlinerData->GetInlineeCount() || !instr->IsProfiledInstr())
                {
                    break;
                }

                const auto profileId = static_cast<Js::ProfileId>(instr->AsProfiledInstr()->u.profileId);
                if (profileId >= func->GetJITFunctionBody()->GetProfiledCallSiteCount())
                {
                    break;
                }

                const auto inlineeData = inlinerData->GetInlinee(profileId);
                if (!inlineeData)
                {
                    break;
                }
                if (PHASE_OFF(Js::InlineCandidatePhase, inlineeData))
                {
                    break;
                }

                // Don't try to inline a function if it doesn't have profile data
                if (!inlineeData->GetBody()->HasProfileInfo())
                {
                    break;
                }

                uint16 constantArguments = 0;
                if (!PHASE_OFF(Js::InlineRecursivePhase, func))
                {
                    instr->IterateArgInstrs([&](IR::Instr* argInstr) {
                        IR::Opnd *src1 = argInstr->GetSrc1();
                        if (!src1->IsRegOpnd())
                        {
                            return false;
                        }
                        StackSym *sym = src1->AsRegOpnd()->m_sym;
                        if (sym->IsIntConst())
                        {
                            if (argInstr->GetSrc2() && argInstr->GetSrc2()->IsSymOpnd())
                            {
                                StackSym *dstSym = argInstr->GetDst()->AsSymOpnd()->m_sym->AsStackSym();
                                Assert(dstSym->IsSingleDef());
                                Assert(dstSym->IsArgSlotSym());
                                Js::ArgSlot argCount = dstSym->GetArgSlotNum() - 1;

                                if (argCount == Js::Constants::MaximumArgumentCountForConstantArgumentInlining)
                                {
                                    return true;
                                }
                                constantArguments |= (1 << argCount);
                            }
                        }
                        return false;
                    });
                }

                if (!inliningHeuristics.BackendInlineIntoInliner(
                    inlineeData, func, this->topFunc, profileId, isCtor, true /*isFixedMethodCall*/,
                    this->IsInliningOutSideLoops(), this->isInLoop != 0, recursiveInlineDepth, constantArguments))
                {
                    break;
                }

                instrNext = this->InlineScriptFunction(instr, inlineeData, symThis, profileId, &isInlined, nullptr, recursiveInlineDepth);

                if (++this->inlineesProcessed == inlinerData->GetInlineeCount())
                {
                    return;
                }

                break;
            }
            case Js::OpCode::CallIExtended:
            {
                if (this->inlineesProcessed == inlinerData->GetInlineeCount())
                {
                    break;
                }

                if (!instr->IsProfiledInstr())
                {
                    break;
                }

                const auto profileId = static_cast<Js::ProfileId>(instr->AsProfiledInstr()->u.profileId);
                if (profileId >= func->GetJITFunctionBody()->GetProfiledCallSiteCount())
                {
                    break;
                }

                const auto inlineeData = inlinerData->GetInlinee(profileId);
                if (!inlineeData)
                {
                    break;
                }

                if (Lowerer::IsSpreadCall(instr))
                {
                    InlineSpread(instr);
                }
                break;
            }

            case Js::OpCode::ArgOut_A:
                InlConstFoldArg(instr, callerArgOuts, callerArgOutCount);
                break;

            case Js::OpCode::LdThis:
                Assert(instr->GetDst() && instr->GetDst()->IsRegOpnd());
                Assert(symThis == nullptr);

                symThis = instr->GetDst()->AsRegOpnd()->m_sym;
                break;

            case Js::OpCode::CheckThis:
                // Is this possible? Can we be walking an inlinee here? Doesn't hurt to support this case...
                Assert(instr->GetSrc1() && instr->GetSrc1()->IsRegOpnd());
                Assert(symThis == nullptr);

                symThis = instr->GetSrc1()->AsRegOpnd()->m_sym;
                break;

            default:
                {
                    if (loopTop && instr->IsBranchInstr())
                    {
                        // Look for the back edge to loopTop.
                        IR::BranchInstr *branch = instr->AsBranchInstr();
                        IR::LabelInstr *labelDestination = branch->GetTarget();
                        if (labelDestination == loopTop) // We found the back edge
                        {
                            backEdgeCount--;
                            if (backEdgeCount == 0) // We have seen all the back edges, hence we are outside loop now.
                            {
                                Assert(this->isInLoop > 0);
                                --this->isInLoop;
                                loopTop = nullptr;
                            }
                        }
                    }
                }

            }
        }

        // If we chose not to inline, let's try to optimize this call if it uses a fixed method
        if (!isInlined)
        {
            switch (instr->m_opcode)
            {
            case Js::OpCode::NewScObject:
            case Js::OpCode::NewScObjArray:
                isCtor = true;
                // intentionally fall through.
            case Js::OpCode::CallI:
                {
                    IR::PropertySymOpnd* methodValueOpnd = GetMethodLdOpndForCallInstr(instr);

                    TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
                    TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
                    StackSym* originalCallTargetStackSym = instr->GetSrc1()->GetStackSym();
                    bool originalCallTargetOpndIsJITOpt = instr->GetSrc1()->GetIsJITOptimizedReg();
                    bool safeThis = false;
                    if (TryOptimizeCallInstrWithFixedMethod(instr, nullptr, isPolymorphic /*isPolymorphic*/, isBuiltIn /*isBuiltIn*/, isCtor /*isCtor*/, false /*isInlined*/, safeThis /*unused here*/))
                    {
                        Assert(originalCallTargetStackSym != nullptr);

                        // Insert a ByteCodeUsesInstr to make sure the methodValueDstOpnd's constant value is captured by any
                        // bailout that occurs between CheckFixedMethodField and CallI.
                        IR::ByteCodeUsesInstr * useCallTargetInstr = IR::ByteCodeUsesInstr::New(instr);
                        useCallTargetInstr->SetRemovedOpndSymbol(originalCallTargetOpndIsJITOpt, originalCallTargetStackSym->m_id);
                        instr->InsertBefore(useCallTargetInstr);

                        // Split NewScObject into NewScObjectNoCtor and CallI, but don't touch NewScObjectArray.
                        if (instr->m_opcode == Js::OpCode::NewScObject && !PHASE_OFF(Js::SplitNewScObjectPhase, this->topFunc))
                        {
                            SplitConstructorCall(instr, false, true);
                        }
                    }
                    else if (instr->m_opcode == Js::OpCode::NewScObjArray)
                    {
                        if (instr->GetDst() && instr->GetDst()->GetValueType().IsLikelyNativeArray())
                        {
                            // We expect to create a native array here, so we'll insert a check against the
                            // expected call target, which requires a bailout.
                            instr = instr->ConvertToBailOutInstr(instr, IR::BailOutOnNotNativeArray);
                        }
                    }
                }
                break;
            }
        }
    } NEXT_INSTR_EDITING;

    INLINE_FLUSH();
}